

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayout::setLayout(QFormLayout *this,int row,ItemRole role,QLayout *layout)

{
  QFormLayoutPrivate *this_00;
  int r;
  int iVar1;
  QFormLayoutPrivate *d;
  long in_FS_OFFSET;
  QFormLayoutItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  r = (int)((ulong)(this_00->m_matrix).m_storage.d.size >> 1);
  if ((r <= row) && (-1 < row - r)) {
    iVar1 = (row - r) + 2;
    do {
      local_40 = (QFormLayoutItem *)0x0;
      QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow(&this_00->m_matrix,r,&local_40);
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  QFormLayoutPrivate::setLayout(this_00,row,role,layout);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::setLayout(int row, ItemRole role, QLayout *layout)
{
    Q_D(QFormLayout);
    int rowCnt = rowCount();
    if (row >= rowCnt)
        d->insertRows(rowCnt, row - rowCnt + 1);
    d->setLayout(row, role, layout);
}